

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.hpp
# Opt level: O0

void __thiscall diy::Collection::destroy(Collection *this,int i)

{
  void *pvVar1;
  Collection *this_00;
  reference ppvVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  void *in_stack_ffffffffffffffd8;
  long *plVar4;
  Collection *in_stack_ffffffffffffffe0;
  
  pvVar1 = find(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if (pvVar1 == (void *)0x0) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0),(long)in_ESI);
    if (*pvVar3 != -1) {
      plVar4 = *(long **)(in_RDI + 0x40);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0),(long)in_ESI);
      (**(code **)(*plVar4 + 0x20))(plVar4,*pvVar3);
    }
  }
  else {
    this_00 = (Collection *)(in_RDI + 0x20);
    find(this_00,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    std::function<void_(void_*)>::operator()
              ((function<void_(void_*)> *)this_00,in_stack_ffffffffffffffd8);
    ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)(in_RDI + 0x88),(long)in_ESI);
    *ppvVar2 = (value_type)0x0;
  }
  return;
}

Assistant:

void          destroy(int i)                  { if (find(i)) { destroy_(find(i)); elements_[static_cast<size_t>(i)] = 0; } else if (external_[static_cast<size_t>(i)] != -1) storage_->destroy(external_[static_cast<size_t>(i)]); }